

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSwap
          (MessageGenerator *this,Printer *printer)

{
  Options *options;
  pointer ppFVar1;
  ulong uVar2;
  bool bVar3;
  OneofDescriptor *pOVar4;
  const_iterator cVar5;
  FieldGenerator *pFVar6;
  FieldDescriptor *field_00;
  FieldDescriptor *field_01;
  Descriptor *descriptor;
  ulong uVar7;
  FieldDescriptor *field_02;
  int iVar8;
  allocator local_159;
  FieldDescriptor *field;
  string first_field_name;
  Formatter format;
  RunMap runs;
  string last_field_name;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  string local_50;
  
  options = &this->options_;
  bVar3 = HasSimpleBaseClass(this->descriptor_,options);
  if (!bVar3) {
    format.printer_ = printer;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_Rb_tree(&format.vars_._M_t,&(this->variables_)._M_t);
    Formatter::operator()<>(&format,"void $classname$::InternalSwap($classname$* other) {\n");
    io::Printer::Indent(format.printer_);
    Formatter::operator()<>(&format,"using std::swap;\n");
    bVar3 = HasGeneratedMethods(*(FileDescriptor **)(this->descriptor_ + 0x10),options);
    if (bVar3) {
      descriptor = this->descriptor_;
      if (0 < *(int *)(descriptor + 0x78)) {
        Formatter::operator()<>(&format,"_extensions_.InternalSwap(&other->_extensions_);\n");
        descriptor = this->descriptor_;
      }
      vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &vars._M_t._M_impl.super__Rb_tree_header._M_header;
      vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      SetUnknownFieldsVariable(descriptor,options,&vars);
      Formatter::AddMap(&format,&vars);
      first_field_name._M_string_length = (size_type)this->descriptor_;
      runs._M_h._M_buckets._0_4_ = 0;
      first_field_name._M_dataplus._M_p._0_4_ =
           *(undefined4 *)(first_field_name._M_string_length + 4);
      runs._M_h._M_bucket_count = first_field_name._M_string_length;
      while( true ) {
        bVar3 = operator!=((Iterator *)&runs,(Iterator *)&first_field_name);
        if (!bVar3) break;
        field_02 = (FieldDescriptor *)
                   ((long)(int)(uint)runs._M_h._M_buckets * 0x48 +
                   *(long *)(runs._M_h._M_bucket_count + 0x28));
        bVar3 = IsString(field_02,options);
        if (bVar3) {
          bVar3 = IsStringInlined(field_02,options);
          if ((!bVar3) && ((~(byte)field_02[1] & 0x60) != 0)) {
            pOVar4 = FieldDescriptor::real_containing_oneof(field_02);
            if (pOVar4 == (OneofDescriptor *)0x0) {
              Formatter::operator()<>
                        (&format,
                         "auto* lhs_arena = GetArenaForAllocation();\nauto* rhs_arena = other->GetArenaForAllocation();\n"
                        );
              break;
            }
          }
        }
        runs._M_h._M_buckets._0_4_ = (uint)runs._M_h._M_buckets + 1;
      }
      Formatter::operator()<>
                (&format,"_internal_metadata_.InternalSwap(&other->_internal_metadata_);\n");
      if ((this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        for (runs._M_h._M_buckets._0_4_ = 0;
            (uint)runs._M_h._M_buckets < (uint)((this->max_has_bit_index_ + 0x1f) / 0x20);
            runs._M_h._M_buckets._0_4_ = (uint)runs._M_h._M_buckets + 1) {
          Formatter::operator()
                    (&format,"swap(_has_bits_[$1$], other->_has_bits_[$1$]);\n",(int *)&runs);
        }
      }
      first_field_name._M_string_length = 0;
      first_field_name.field_2._8_8_ =
           std::
           _Function_handler<bool_(const_google::protobuf::FieldDescriptor_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc:3464:36)>
           ::_M_invoke;
      first_field_name.field_2._M_allocated_capacity =
           (size_type)
           std::
           _Function_handler<bool_(const_google::protobuf::FieldDescriptor_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc:3464:36)>
           ::_M_manager;
      first_field_name._M_dataplus._M_p = (pointer)this;
      anon_unknown_0::FindRuns
                (&runs,&this->optimized_order_,
                 (function<bool_(const_google::protobuf::FieldDescriptor_*)> *)&first_field_name);
      std::_Function_base::~_Function_base((_Function_base *)&first_field_name);
      iVar8 = 0;
      while( true ) {
        uVar7 = (ulong)iVar8;
        ppFVar1 = (this->optimized_order_).
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(this->optimized_order_).
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar1 >> 3) <= uVar7)
        break;
        field = ppFVar1[uVar7];
        cVar5 = std::
                _Hashtable<const_google::protobuf::FieldDescriptor_*,_std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_google::protobuf::FieldDescriptor_*>,_std::hash<const_google::protobuf::FieldDescriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&runs._M_h,&field);
        if ((cVar5.
             super__Node_iterator_base<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_false>
             ._M_cur == (__node_type *)0x0) ||
           (uVar2 = *(ulong *)((long)cVar5.
                                     super__Node_iterator_base<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_false>
                                     ._M_cur + 0x10), uVar2 < 2)) {
          pFVar6 = FieldGeneratorMap::get(&this->field_generators_,field);
          (*pFVar6->_vptr_FieldGenerator[0xe])(pFVar6,printer);
        }
        else {
          FieldName_abi_cxx11_(&first_field_name,(cpp *)field,field_00);
          FieldName_abi_cxx11_
                    (&last_field_name,
                     (cpp *)(this->optimized_order_).
                            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar2 + (uVar7 - 1)],field_01)
          ;
          std::__cxx11::string::string((string *)&local_50,"first",&local_159);
          Formatter::Set<std::__cxx11::string>(&format,&local_50,&first_field_name);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::string((string *)&local_50,"last",&local_159);
          Formatter::Set<std::__cxx11::string>(&format,&local_50,&last_field_name);
          std::__cxx11::string::~string((string *)&local_50);
          Formatter::operator()<>
                    (&format,
                     "::PROTOBUF_NAMESPACE_ID::internal::memswap<\n    PROTOBUF_FIELD_OFFSET($classname$, $last$_)\n    + sizeof($classname$::$last$_)\n    - PROTOBUF_FIELD_OFFSET($classname$, $first$_)>(\n        reinterpret_cast<char*>(&$first$_),\n        reinterpret_cast<char*>(&other->$first$_));\n"
                    );
          iVar8 = iVar8 + (int)uVar2 + -1;
          std::__cxx11::string::~string((string *)&last_field_name);
          std::__cxx11::string::~string((string *)&first_field_name);
        }
        iVar8 = iVar8 + 1;
      }
      first_field_name._M_string_length = (size_type)this->descriptor_;
      first_field_name._M_dataplus._M_p = first_field_name._M_dataplus._M_p & 0xffffffff00000000;
      last_field_name._M_dataplus._M_p._0_4_ =
           *(undefined4 *)(first_field_name._M_string_length + 0x6c);
      last_field_name._M_string_length = first_field_name._M_string_length;
      while( true ) {
        bVar3 = operator!=((Iterator *)&first_field_name,(Iterator *)&last_field_name);
        if (!bVar3) break;
        Formatter::operator()
                  (&format,"swap($1$_, other->$1$_);\n",
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (*(long *)(first_field_name._M_string_length + 0x30) + 8 +
                    (long)(int)first_field_name._M_dataplus._M_p * 0x28));
        first_field_name._M_dataplus._M_p._0_4_ = (int)first_field_name._M_dataplus._M_p + 1;
      }
      iVar8 = 0;
      while (first_field_name._M_dataplus._M_p._0_4_ = iVar8,
            iVar8 < *(int *)(this->descriptor_ + 0x6c)) {
        Formatter::operator()
                  (&format,"swap(_oneof_case_[$1$], other->_oneof_case_[$1$]);\n",
                   (int *)&first_field_name);
        iVar8 = (int)first_field_name._M_dataplus._M_p + 1;
      }
      if (this->num_weak_fields_ != 0) {
        Formatter::operator()<>
                  (&format,"_weak_field_map_.UnsafeArenaSwap(&other->_weak_field_map_);\n");
      }
      std::
      _Hashtable<const_google::protobuf::FieldDescriptor_*,_std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_google::protobuf::FieldDescriptor_*>,_std::hash<const_google::protobuf::FieldDescriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&runs._M_h);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&vars._M_t);
    }
    else {
      Formatter::operator()<>(&format,"GetReflection()->Swap(this, other);");
    }
    io::Printer::Outdent(format.printer_);
    Formatter::operator()<>(&format,"}\n");
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&format.vars_._M_t);
  }
  return;
}

Assistant:

void MessageGenerator::GenerateSwap(io::Printer* printer) {
  if (HasSimpleBaseClass(descriptor_, options_)) return;
  Formatter format(printer, variables_);

  format("void $classname$::InternalSwap($classname$* other) {\n");
  format.Indent();
  format("using std::swap;\n");

  if (HasGeneratedMethods(descriptor_->file(), options_)) {
    if (descriptor_->extension_range_count() > 0) {
      format("_extensions_.InternalSwap(&other->_extensions_);\n");
    }

    std::map<std::string, std::string> vars;
    SetUnknownFieldsVariable(descriptor_, options_, &vars);
    format.AddMap(vars);
    if (HasSingularString(descriptor_, options_)) {
      format(
          "auto* lhs_arena = GetArenaForAllocation();\n"
          "auto* rhs_arena = other->GetArenaForAllocation();\n");
    }
    format("_internal_metadata_.InternalSwap(&other->_internal_metadata_);\n");

    if (!has_bit_indices_.empty()) {
      for (int i = 0; i < HasBitsSize(); ++i) {
        format("swap(_has_bits_[$1$], other->_has_bits_[$1$]);\n", i);
      }
    }

    // If possible, we swap several fields at once, including padding.
    const RunMap runs =
        FindRuns(optimized_order_, [this](const FieldDescriptor* field) {
          return CanBeManipulatedAsRawBytes(field, options_, scc_analyzer_);
        });

    for (int i = 0; i < optimized_order_.size(); ++i) {
      const FieldDescriptor* field = optimized_order_[i];
      const auto it = runs.find(field);

      // We only apply the memswap technique to runs of more than one field, as
      // `swap(field_, other.field_)` is better than
      // `memswap<...>(&field_, &other.field_)` for generated code readability.
      if (it != runs.end() && it->second > 1) {
        // Use a memswap, then skip run_length fields.
        const size_t run_length = it->second;
        const std::string first_field_name = FieldName(field);
        const std::string last_field_name =
            FieldName(optimized_order_[i + run_length - 1]);

        format.Set("first", first_field_name);
        format.Set("last", last_field_name);

        format(
            "::PROTOBUF_NAMESPACE_ID::internal::memswap<\n"
            "    PROTOBUF_FIELD_OFFSET($classname$, $last$_)\n"
            "    + sizeof($classname$::$last$_)\n"
            "    - PROTOBUF_FIELD_OFFSET($classname$, $first$_)>(\n"
            "        reinterpret_cast<char*>(&$first$_),\n"
            "        reinterpret_cast<char*>(&other->$first$_));\n");

        i += run_length - 1;
        // ++i at the top of the loop.
      } else {
        field_generators_.get(field).GenerateSwappingCode(printer);
      }
    }

    for (auto oneof : OneOfRange(descriptor_)) {
      format("swap($1$_, other->$1$_);\n", oneof->name());
    }

    for (int i = 0; i < descriptor_->real_oneof_decl_count(); i++) {
      format("swap(_oneof_case_[$1$], other->_oneof_case_[$1$]);\n", i);
    }

    if (num_weak_fields_) {
      format("_weak_field_map_.UnsafeArenaSwap(&other->_weak_field_map_);\n");
    }
  } else {
    format("GetReflection()->Swap(this, other);");
  }

  format.Outdent();
  format("}\n");
}